

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

int try_connect(NetSocket *sock)

{
  SockAddr *pSVar1;
  addrinfo *paVar2;
  Plug *pPVar3;
  socklen_t __len;
  int iVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  char *pcVar8;
  ushort uVar9;
  anon_enum_32 __domain;
  sockaddr *__addr;
  socklen_t __len_00;
  bool bVar10;
  sockaddr local_2d8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  SockAddr thisaddr;
  
  __addr = (sockaddr *)&local_2d8;
  del234(sktree,sock);
  if (-1 < sock->s) {
    close(sock->s);
  }
  pSVar1 = sock->addr;
  memcpy(&thisaddr,pSVar1,0x220);
  thisaddr.refcount = 1;
  if (pSVar1->superfamily == IP) {
    thisaddr.ais = (sock->step).ai;
  }
  (*sock->plug->vt->log)(sock->plug,PLUGLOG_CONNECT_TRYING,&thisaddr,sock->port,(char *)0x0,0);
  __domain = sock->addr->superfamily;
  if (__domain != UNIX) {
    if (__domain == UNRESOLVED) {
LAB_00143772:
      __assert_fail("family != AF_UNSPEC",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                    ,0x241,"int try_connect(NetSocket *)");
    }
    paVar2 = (sock->step).ai;
    if (paVar2 == (addrinfo *)0x0) {
      __domain = IP;
    }
    else {
      __domain = paVar2->ai_family;
      if (__domain == UNRESOLVED) goto LAB_00143772;
    }
  }
  iVar4 = socket(__domain,1,0);
  sock->s = iVar4;
  if (iVar4 < 0) {
    piVar6 = __errno_location();
    iVar5 = *piVar6;
    goto LAB_00143a21;
  }
  cloexec(iVar4);
  if (sock->oobinline == true) {
    thisaddr.refcount = 1;
    iVar5 = setsockopt(iVar4,1,10,&thisaddr,4);
    if (-1 < iVar5) goto LAB_001437e3;
LAB_00143919:
    piVar6 = __errno_location();
    iVar5 = *piVar6;
    close(iVar4);
  }
  else {
LAB_001437e3:
    if ((__domain != UNIX) && (sock->nodelay != false)) {
      thisaddr.refcount = 1;
      iVar5 = setsockopt(iVar4,6,1,&thisaddr,4);
      if (iVar5 < 0) goto LAB_00143919;
    }
    if (sock->keepalive == true) {
      thisaddr.refcount = 1;
      iVar5 = setsockopt(iVar4,1,9,&thisaddr,4);
      if (iVar5 < 0) goto LAB_00143919;
    }
    uVar9 = 0x3ff;
    if (sock->privport == false) {
      uVar9 = 0;
    }
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288 = 0;
    uStack_280 = 0;
    local_298 = 0;
    uStack_290 = 0;
    local_2a8 = 0;
    uStack_2a0 = 0;
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2d8.sa_family = 0;
    local_2d8.sa_data[0] = '\0';
    local_2d8.sa_data[1] = '\0';
    local_2d8.sa_data[2] = '\0';
    local_2d8.sa_data[3] = '\0';
    local_2d8.sa_data[4] = '\0';
    local_2d8.sa_data[5] = '\0';
    local_2d8.sa_data[6] = '\0';
    local_2d8.sa_data[7] = '\0';
    local_2d8.sa_data[8] = '\0';
    local_2d8.sa_data[9] = '\0';
    local_2d8.sa_data[10] = '\0';
    local_2d8.sa_data[0xb] = '\0';
    local_2d8.sa_data[0xc] = '\0';
    local_2d8.sa_data[0xd] = '\0';
    if (__domain == UNIX) {
      pcVar8 = sock->addr->hostname;
      sVar7 = strlen(pcVar8);
      if (0x6b < sVar7) {
        __assert_fail("strlen(sock->addr->hostname) < sizeof u.su.sun_path",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                      ,700,"int try_connect(NetSocket *)");
      }
      local_2d8.sa_family = 1;
      strcpy(local_2d8.sa_data,pcVar8);
      __len_00 = 0x6e;
LAB_00143995:
      nonblock(iVar4);
      iVar4 = connect(iVar4,(sockaddr *)__addr,__len_00);
      if (iVar4 < 0) {
        piVar6 = __errno_location();
        iVar5 = *piVar6;
        if (iVar5 != 0x73) goto LAB_00143a21;
      }
      else {
        sock->connected = true;
        sock->writable = true;
        pSVar1 = sock->addr;
        memcpy(&thisaddr,pSVar1,0x220);
        thisaddr.refcount = 1;
        if (pSVar1->superfamily == IP) {
          thisaddr.ais = (sock->step).ai;
        }
        (*sock->plug->vt->log)
                  (sock->plug,PLUGLOG_CONNECT_SUCCESS,&thisaddr,sock->port,(char *)0x0,0);
      }
      uxsel_tell(sock);
      iVar5 = 0;
    }
    else {
      if ((__domain | 8) != 10) {
        __assert_fail("family == AF_INET",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                      ,0x286,"int try_connect(NetSocket *)");
      }
      do {
        if (__domain == 10) {
          local_2d8.sa_family = 10;
          local_2d8.sa_data[6] = in6addr_any;
          local_2d8.sa_data[7] = in6addr_any_1;
          local_2d8.sa_data[8] = cRam00000000001a81f2;
          local_2d8.sa_data[9] = cRam00000000001a81f3;
          local_2d8.sa_data[10] = cRam00000000001a81f4;
          local_2d8.sa_data[0xb] = cRam00000000001a81f5;
          local_2d8.sa_data[0xc] = cRam00000000001a81f6;
          local_2d8.sa_data[0xd] = cRam00000000001a81f7;
          local_2c8 = _flock;
          __len = 0x1c;
        }
        else {
          local_2d8.sa_family = 2;
          local_2d8.sa_data[0] = '\0';
          local_2d8.sa_data[1] = '\0';
          local_2d8.sa_data[2] = '\0';
          local_2d8.sa_data[3] = '\0';
          local_2d8.sa_data[4] = '\0';
          local_2d8.sa_data[5] = '\0';
          __len = 0x10;
        }
        local_2d8.sa_data._0_2_ = uVar9 << 8 | uVar9 >> 8;
        iVar5 = bind(iVar4,&local_2d8,__len);
        if (-1 < iVar5) {
LAB_0014396c:
          if ((__domain != 10) && (__domain != IP)) {
            __assert_fail("false && \"unknown address family\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                          ,0x2c4,"int try_connect(NetSocket *)");
          }
          uVar9 = (ushort)sock->port;
          paVar2 = (sock->step).ai;
          __addr = paVar2->ai_addr;
          *(ushort *)__addr->sa_data = uVar9 << 8 | uVar9 >> 8;
          __len_00 = paVar2->ai_addrlen;
          goto LAB_00143995;
        }
        piVar6 = __errno_location();
        iVar5 = *piVar6;
        if (iVar5 != 0x62) {
          if (iVar5 == 0) goto LAB_0014396c;
          goto LAB_00143a21;
        }
        bVar10 = 1 < uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar10);
      iVar5 = 0x62;
    }
  }
LAB_00143a21:
  add234(sktree,sock);
  if (iVar5 != 0) {
    pSVar1 = sock->addr;
    memcpy(&thisaddr,pSVar1,0x220);
    thisaddr.refcount = 1;
    if (pSVar1->superfamily == IP) {
      thisaddr.ais = (sock->step).ai;
    }
    pPVar3 = sock->plug;
    iVar4 = sock->port;
    pcVar8 = strerror(iVar5);
    (*pPVar3->vt->log)(pPVar3,PLUGLOG_CONNECT_FAILED,&thisaddr,iVar4,pcVar8,iVar5);
  }
  return iVar5;
}

Assistant:

static int try_connect(NetSocket *sock)
{
    int s;
    union sockaddr_union u;
    const union sockaddr_union *sa;
    int err = 0;
    short localport;
    int salen, family;

    /*
     * Remove the socket from the tree before we overwrite its
     * internal socket id, because that forms part of the tree's
     * sorting criterion. We'll add it back before exiting this
     * function, whether we changed anything or not.
     */
    del234(sktree, sock);

    if (sock->s >= 0)
        close(sock->s);

    {
        SockAddr thisaddr = sk_extractaddr_tmp(
            sock->addr, &sock->step);
        plug_log(sock->plug, PLUGLOG_CONNECT_TRYING,
                 &thisaddr, sock->port, NULL, 0);
    }

    /*
     * Open socket.
     */
    family = SOCKADDR_FAMILY(sock->addr, sock->step);
    assert(family != AF_UNSPEC);
    s = socket(family, SOCK_STREAM, 0);
    sock->s = s;

    if (s < 0) {
        err = errno;
        goto ret;
    }

    cloexec(s);

    if (sock->oobinline) {
        int b = 1;
        if (setsockopt(s, SOL_SOCKET, SO_OOBINLINE,
                       (void *) &b, sizeof(b)) < 0) {
            err = errno;
            close(s);
            goto ret;
        }
    }

    if (sock->nodelay && family != AF_UNIX) {
        int b = 1;
        if (setsockopt(s, IPPROTO_TCP, TCP_NODELAY,
                       (void *) &b, sizeof(b)) < 0) {
            err = errno;
            close(s);
            goto ret;
        }
    }

    if (sock->keepalive) {
        int b = 1;
        if (setsockopt(s, SOL_SOCKET, SO_KEEPALIVE,
                       (void *) &b, sizeof(b)) < 0) {
            err = errno;
            close(s);
            goto ret;
        }
    }

    /*
     * Bind to local address.
     */
    if (sock->privport)
        localport = 1023;              /* count from 1023 downwards */
    else
        localport = 0;                 /* just use port 0 (ie kernel picks) */

    /* BSD IP stacks need sockaddr_in zeroed before filling in */
    memset(&u,'\0',sizeof(u));

    /* We don't try to bind to a local address for UNIX domain sockets.  (Why
     * do we bother doing the bind when localport == 0 anyway?) */
    if (family != AF_UNIX) {
        /* Loop round trying to bind */
        while (1) {
            int retcode;

#ifndef NO_IPV6
            if (family == AF_INET6) {
                /* XXX use getaddrinfo to get a local address? */
                u.sin6.sin6_family = AF_INET6;
                u.sin6.sin6_addr = in6addr_any;
                u.sin6.sin6_port = htons(localport);
                retcode = bind(s, &u.sa, sizeof(u.sin6));
            } else
#endif
            {
                assert(family == AF_INET);
                u.sin.sin_family = AF_INET;
                u.sin.sin_addr.s_addr = htonl(INADDR_ANY);
                u.sin.sin_port = htons(localport);
                retcode = bind(s, &u.sa, sizeof(u.sin));
            }
            if (retcode >= 0) {
                err = 0;
                break;                 /* done */
            } else {
                err = errno;
                if (err != EADDRINUSE) /* failed, for a bad reason */
                  break;
            }

            if (localport == 0)
              break;                   /* we're only looping once */
            localport--;
            if (localport == 0)
              break;                   /* we might have got to the end */
        }

        if (err)
            goto ret;
    }

    /*
     * Connect to remote address.
     */
    switch(family) {
#ifndef NO_IPV6
      case AF_INET:
        /* XXX would be better to have got getaddrinfo() to fill in the port. */
        ((struct sockaddr_in *)sock->step.ai->ai_addr)->sin_port =
            htons(sock->port);
        sa = (const union sockaddr_union *)sock->step.ai->ai_addr;
        salen = sock->step.ai->ai_addrlen;
        break;
      case AF_INET6:
        ((struct sockaddr_in *)sock->step.ai->ai_addr)->sin_port =
            htons(sock->port);
        sa = (const union sockaddr_union *)sock->step.ai->ai_addr;
        salen = sock->step.ai->ai_addrlen;
        break;
#else
      case AF_INET:
        u.sin.sin_family = AF_INET;
        u.sin.sin_addr.s_addr = htonl(sock->addr->addresses[sock->step.curraddr]);
        u.sin.sin_port = htons((short) sock->port);
        sa = &u;
        salen = sizeof u.sin;
        break;
#endif
      case AF_UNIX:
        assert(strlen(sock->addr->hostname) < sizeof u.su.sun_path);
        u.su.sun_family = AF_UNIX;
        strcpy(u.su.sun_path, sock->addr->hostname);
        sa = &u;
        salen = sizeof u.su;
        break;

      default:
        unreachable("unknown address family");
        exit(1); /* XXX: GCC doesn't understand assert() on some systems. */
    }

    nonblock(s);

    if ((connect(s, &(sa->sa), salen)) < 0) {
        if ( errno != EINPROGRESS ) {
            err = errno;
            goto ret;
        }
    } else {
        /*
         * If we _don't_ get EWOULDBLOCK, the connect has completed
         * and we should set the socket as connected and writable.
         */
        sock->connected = true;
        sock->writable = true;

        SockAddr thisaddr = sk_extractaddr_tmp(sock->addr, &sock->step);
        plug_log(sock->plug, PLUGLOG_CONNECT_SUCCESS,
                 &thisaddr, sock->port, NULL, 0);
    }

    uxsel_tell(sock);

    ret:

    /*
     * No matter what happened, put the socket back in the tree.
     */
    add234(sktree, sock);

    if (err) {
        SockAddr thisaddr = sk_extractaddr_tmp(
            sock->addr, &sock->step);
        plug_log(sock->plug, PLUGLOG_CONNECT_FAILED,
                 &thisaddr, sock->port, strerror(err), err);
    }
    return err;
}